

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3_reset_auto_extension(void)

{
  int iVar1;
  sqlite3_mutex *psVar2;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    if (sqlite3Config.bCoreMutex == 0) {
      psVar2 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar2 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    }
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar2);
      sqlite3_free(sqlite3Autoext_1);
      sqlite3Autoext_1 = (void *)0x0;
      sqlite3Autoext_0 = 0;
      (*sqlite3Config.mutex.xMutexLeave)(psVar2);
      return;
    }
    sqlite3_free(sqlite3Autoext_1);
    sqlite3Autoext_1 = (void *)0x0;
    sqlite3Autoext_0 = 0;
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_reset_auto_extension(void){
#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize()==SQLITE_OK )
#endif
  {
#if SQLITE_THREADSAFE
    sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
    wsdAutoextInit;
    sqlite3_mutex_enter(mutex);
    sqlite3_free(wsdAutoext.aExt);
    wsdAutoext.aExt = 0;
    wsdAutoext.nExt = 0;
    sqlite3_mutex_leave(mutex);
  }
}